

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.cpp
# Opt level: O1

VMatrix * __thiscall
rlottie::internal::model::Repeater::Transform::matrix
          (VMatrix *__return_storage_ptr__,Transform *this,int frameNo,float multiplier)

{
  VMatrix *pVVar1;
  float fVar2;
  float fVar3;
  float dx;
  float dy;
  VPointF VVar4;
  
  if ((this->mScale).isValue_ == true) {
    VVar4 = (this->mScale).impl_.value_;
    fVar2 = VVar4.mx;
    fVar3 = VVar4.my;
  }
  else {
    VVar4 = KeyFrames<VPointF,_void>::value((this->mScale).impl_,frameNo);
    fVar2 = VVar4.mx;
    fVar3 = VVar4.my;
  }
  fVar2 = powf(fVar2 / 100.0,multiplier);
  fVar3 = powf(fVar3 / 100.0,multiplier);
  __return_storage_ptr__->m11 = 1.0;
  __return_storage_ptr__->m12 = 0.0;
  __return_storage_ptr__->m13 = 0.0;
  __return_storage_ptr__->m21 = 0.0;
  __return_storage_ptr__->m22 = 1.0;
  __return_storage_ptr__->m23 = 0.0;
  __return_storage_ptr__->mtx = 0.0;
  __return_storage_ptr__->mty = 0.0;
  __return_storage_ptr__->m33 = 1.0;
  __return_storage_ptr__->mType = None;
  __return_storage_ptr__->dirty = None;
  if ((this->mPosition).isValue_ == true) {
    VVar4 = (this->mPosition).impl_.value_;
  }
  else {
    VVar4 = KeyFrames<VPointF,_void>::value((this->mPosition).impl_,frameNo);
  }
  pVVar1 = VMatrix::translate(__return_storage_ptr__,VVar4.mx * multiplier,VVar4.my * multiplier);
  if ((this->mAnchor).isValue_ == true) {
    VVar4 = (this->mAnchor).impl_.value_;
    dx = VVar4.mx;
    dy = VVar4.my;
  }
  else {
    VVar4 = KeyFrames<VPointF,_void>::value((this->mAnchor).impl_,frameNo);
    dx = VVar4.mx;
    dy = VVar4.my;
  }
  pVVar1 = VMatrix::translate(pVVar1,dx,dy);
  pVVar1 = VMatrix::scale(pVVar1,fVar2,fVar3);
  if ((this->mRotation).isValue_ == true) {
    fVar2 = (this->mRotation).impl_.value_;
  }
  else {
    fVar2 = KeyFrames<float,_void>::value((this->mRotation).impl_,frameNo);
  }
  pVVar1 = VMatrix::rotate(pVVar1,fVar2 * multiplier,Z);
  if ((this->mAnchor).isValue_ == true) {
    VVar4 = (this->mAnchor).impl_.value_;
  }
  else {
    VVar4 = KeyFrames<VPointF,_void>::value((this->mAnchor).impl_,frameNo);
  }
  VMatrix::translate(pVVar1,-VVar4.mx,-VVar4.my);
  return __return_storage_ptr__;
}

Assistant:

VMatrix model::Repeater::Transform::matrix(int frameNo, float multiplier) const
{
    VPointF scale = mScale.value(frameNo) / 100.f;
    scale.setX(std::pow(scale.x(), multiplier));
    scale.setY(std::pow(scale.y(), multiplier));
    VMatrix m;
    m.translate(mPosition.value(frameNo) * multiplier)
        .translate(mAnchor.value(frameNo))
        .scale(scale)
        .rotate(mRotation.value(frameNo) * multiplier)
        .translate(-mAnchor.value(frameNo));

    return m;
}